

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::createInstance
          (BeagleCPUImpl<float,_1,_0> *this,int tipCount,int partialsBufferCount,
          int compactBufferCount,int stateCount,int patternCount,int eigenDecompositionCount,
          int matrixCount,int categoryCount,int scaleBufferCount,int resourceNumber,
          int pluginResourceNumber,long preferenceFlags,long requirementFlags)

{
  float ***pppfVar1;
  size_t __size;
  int iVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  byte bVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  EigenDecompositionSquare<float,_1> *this_00;
  double **ppdVar24;
  double *pdVar25;
  float **ppfVar26;
  int **ppiVar27;
  float *pfVar28;
  short *psVar29;
  float *pfVar30;
  void *pvVar31;
  int *piVar32;
  undefined8 *puVar33;
  int iVar34;
  ulong uVar35;
  long lVar36;
  long lVar37;
  uint uVar38;
  size_t sVar39;
  long lVar40;
  ushort uVar41;
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [16];
  undefined1 in_ZMM6 [64];
  void *ptr;
  float *local_88;
  size_t local_80;
  undefined1 local_78 [64];
  
  this->realtypeMin = 1.1754944e-38;
  this->scalingExponentThreshold = 0x14;
  *(int *)&(this->super_BeagleImpl).field_0xc = partialsBufferCount + compactBufferCount;
  this->kTipCount = tipCount;
  this->kStateCount = stateCount;
  this->kPatternCount = patternCount;
  this->kPartitionCount = 1;
  this->kMaxPartitionCount = 1;
  this->kPartitionsInitialised = false;
  this->kPatternsReordered = false;
  this->kInternalPartialsBufferCount = (partialsBufferCount + compactBufferCount) - tipCount;
  this->kTransPaddedStateCount = stateCount + 1;
  this->kPartialsPaddedStateCount = stateCount;
  iVar20 = (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x5c])();
  iVar2 = this->kStateCount;
  iVar34 = this->kPatternCount % iVar20;
  iVar20 = iVar20 - iVar34;
  if (iVar34 == 0) {
    iVar20 = 0;
  }
  iVar34 = this->kPatternCount + iVar20;
  this->kPaddedPatternCount = iVar34;
  this->kExtraPatterns = iVar20;
  this->kMatrixCount = matrixCount;
  this->kEigenDecompCount = eigenDecompositionCount;
  this->kCategoryCount = categoryCount;
  this->kScaleBufferCount = scaleBufferCount;
  this->kMatrixSize = (iVar2 + 1) * iVar2;
  this->kFlags = 0;
  uVar38 = (uint)requirementFlags;
  uVar21 = (uint)preferenceFlags;
  if ((char)((byte)requirementFlags | (byte)preferenceFlags) < '\0') {
    this->kFlags = 0x480;
    iVar20 = this->kInternalPartialsBufferCount;
LAB_001306dd:
    this->kScaleBufferCount = iVar20;
  }
  else {
    if (((uVar38 | uVar21) >> 8 & 1) != 0) {
      this->kFlags = 0x500;
      iVar20 = this->kInternalPartialsBufferCount + 1;
      goto LAB_001306dd;
    }
    if (((uVar38 | uVar21) >> 0x19 & 1) == 0) {
      if (((uVar38 | uVar21) >> 10 & 1) == 0) {
        this->kFlags = 0x240;
      }
      else {
        this->kFlags = 0x440;
      }
    }
    else {
      this->kFlags = 0x2000200;
    }
  }
  uVar38 = uVar38 | uVar21;
  uVar23 = (ulong)(((uVar38 & 0x20) >> 5) << 4) + 0x10 | this->kFlags;
  lVar36 = 0x40000000;
  if ((uVar38 >> 0x1e & 1) == 0) {
    lVar36 = 0x4000;
  }
  uVar35 = (ulong)(uVar38 >> 1 & 0x100000) + 0x100000 + lVar36 | uVar23;
  this->kFlags = uVar35;
  if ((uVar23 & 0x20) == 0) {
    this_00 = (EigenDecompositionSquare<float,_1> *)operator_new(0x48);
    EigenDecompositionCube<float,_1>::EigenDecompositionCube
              ((EigenDecompositionCube<float,_1> *)this_00,eigenDecompositionCount,iVar2,
               categoryCount,uVar35);
  }
  else {
    this_00 = (EigenDecompositionSquare<float,_1> *)operator_new(0x58);
    EigenDecompositionSquare<float,_1>::EigenDecompositionSquare
              (this_00,eigenDecompositionCount,iVar2,categoryCount,uVar35);
  }
  this->gEigenDecomposition = &this_00->super_EigenDecomposition<float,_1>;
  sVar39 = (size_t)this->kEigenDecompCount;
  ppdVar24 = (double **)calloc(8,sVar39);
  this->gCategoryRates = ppdVar24;
  if (ppdVar24 != (double **)0x0) {
    pdVar25 = (double *)malloc((long)this->kPatternCount << 3);
    this->gPatternWeights = pdVar25;
    if (pdVar25 != (double *)0x0) {
      this->kPartialsSize =
           this->kPartialsPaddedStateCount * this->kPaddedPatternCount * this->kCategoryCount;
      iVar2 = *(int *)&(this->super_BeagleImpl).field_0xc;
      __size = (long)iVar2 * 8;
      ppfVar26 = (float **)malloc(__size);
      this->gPartials = ppfVar26;
      if (ppfVar26 != (float **)0x0) {
        ppfVar26 = (float **)calloc(8,sVar39);
        this->gStateFrequencies = ppfVar26;
        if (ppfVar26 != (float **)0x0) {
          ppfVar26 = (float **)calloc(8,sVar39);
          this->gCategoryWeights = ppfVar26;
          if (ppfVar26 != (float **)0x0) {
            ppiVar27 = (int **)malloc(__size);
            this->gTipStates = ppiVar27;
            if (ppiVar27 != (int **)0x0) {
              if (0 < iVar2) {
                lVar36 = 0;
                do {
                  this->gPartials[lVar36] = (float *)0x0;
                  this->gTipStates[lVar36] = (int *)0x0;
                  lVar36 = lVar36 + 1;
                } while (iVar2 != lVar36);
              }
              lVar36 = (long)this->kTipCount;
              if (this->kTipCount < *(int *)&(this->super_BeagleImpl).field_0xc) {
                do {
                  local_88 = (float *)0x0;
                  posix_memalign(&local_88,0x20,(long)this->kPartialsSize << 2);
                  this->gPartials[lVar36] = local_88;
                  if (this->gPartials[lVar36] == (float *)0x0) goto LAB_00131081;
                  lVar36 = lVar36 + 1;
                } while (lVar36 < *(int *)&(this->super_BeagleImpl).field_0xc);
              }
              this->gScaleBuffers = (float **)0x0;
              this->gAutoScaleBuffers = (short **)0x0;
              lVar36 = this->kFlags;
              iVar2 = this->kScaleBufferCount;
              lVar37 = (long)iVar2;
              ppfVar26 = (float **)malloc(lVar37 * 8);
              auVar61 = in_ZMM6._0_16_;
              if ((char)lVar36 < '\0') {
                this->gAutoScaleBuffers = (short **)ppfVar26;
                if (ppfVar26 == (float **)0x0) goto LAB_00131081;
                if (0 < iVar2) {
                  lVar36 = 0;
                  do {
                    psVar29 = (short *)malloc((long)iVar34 * 2);
                    auVar61 = in_ZMM6._0_16_;
                    this->gAutoScaleBuffers[lVar36] = psVar29;
                    if (this->gAutoScaleBuffers[lVar36] == (short *)0x0) goto LAB_00131081;
                    lVar36 = lVar36 + 1;
                  } while (lVar37 != lVar36);
                }
                piVar32 = (int *)malloc((long)this->kInternalPartialsBufferCount << 2);
                this->gActiveScalingFactors = piVar32;
                ppfVar26 = (float **)malloc(8);
                this->gScaleBuffers = ppfVar26;
                pfVar28 = (float *)malloc((long)iVar34 << 2);
                *ppfVar26 = pfVar28;
              }
              else {
                pppfVar1 = &this->gScaleBuffers;
                *pppfVar1 = ppfVar26;
                if (ppfVar26 == (float **)0x0) goto LAB_00131081;
                if (0 < iVar2) {
                  local_80 = (long)iVar34 << 2;
                  auVar42 = vpbroadcastq_avx512f();
                  lVar40 = 0;
                  local_78 = vmovdqu64_avx512f(auVar42);
                  do {
                    in_ZMM6 = ZEXT1664(in_ZMM6._0_16_);
                    pfVar28 = (float *)malloc(local_80);
                    auVar61 = in_ZMM6._0_16_;
                    (*pppfVar1)[lVar40] = pfVar28;
                    pfVar28 = (*pppfVar1)[lVar40];
                    if (pfVar28 == (float *)0x0) goto LAB_00131081;
                    auVar42 = vmovdqu64_avx512f(local_78);
                    auVar43 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                    auVar44 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                    auVar45 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                    if (0 < iVar34 && ((uint)lVar36 >> 0x19 & 1) != 0) {
                      uVar23 = 0;
                      do {
                        auVar46 = vpbroadcastq_avx512f();
                        auVar47 = vporq_avx512f(auVar46,auVar43);
                        auVar46 = vporq_avx512f(auVar46,auVar44);
                        uVar17 = vpcmpuq_avx512f(auVar46,auVar42,2);
                        uVar18 = vpcmpuq_avx512f(auVar47,auVar42,2);
                        bVar19 = (byte)uVar18;
                        uVar41 = CONCAT11(bVar19,(byte)uVar17);
                        pfVar30 = pfVar28 + uVar23;
                        bVar3 = (bool)((byte)uVar17 & 1);
                        bVar4 = (bool)((byte)(uVar41 >> 1) & 1);
                        bVar5 = (bool)((byte)(uVar41 >> 2) & 1);
                        bVar6 = (bool)((byte)(uVar41 >> 3) & 1);
                        bVar7 = (bool)((byte)(uVar41 >> 4) & 1);
                        bVar8 = (bool)((byte)(uVar41 >> 5) & 1);
                        bVar9 = (bool)((byte)(uVar41 >> 6) & 1);
                        bVar10 = (bool)((byte)(uVar41 >> 7) & 1);
                        bVar11 = (bool)(bVar19 >> 1 & 1);
                        bVar12 = (bool)(bVar19 >> 2 & 1);
                        bVar13 = (bool)(bVar19 >> 3 & 1);
                        bVar14 = (bool)(bVar19 >> 4 & 1);
                        bVar15 = (bool)(bVar19 >> 5 & 1);
                        bVar16 = (bool)(bVar19 >> 6 & 1);
                        *pfVar30 = (float)((uint)bVar3 * auVar45._0_4_ |
                                          (uint)!bVar3 * (int)*pfVar30);
                        pfVar30[1] = (float)((uint)bVar4 * auVar45._4_4_ |
                                            (uint)!bVar4 * (int)pfVar30[1]);
                        pfVar30[2] = (float)((uint)bVar5 * auVar45._8_4_ |
                                            (uint)!bVar5 * (int)pfVar30[2]);
                        pfVar30[3] = (float)((uint)bVar6 * auVar45._12_4_ |
                                            (uint)!bVar6 * (int)pfVar30[3]);
                        pfVar30[4] = (float)((uint)bVar7 * auVar45._16_4_ |
                                            (uint)!bVar7 * (int)pfVar30[4]);
                        pfVar30[5] = (float)((uint)bVar8 * auVar45._20_4_ |
                                            (uint)!bVar8 * (int)pfVar30[5]);
                        pfVar30[6] = (float)((uint)bVar9 * auVar45._24_4_ |
                                            (uint)!bVar9 * (int)pfVar30[6]);
                        pfVar30[7] = (float)((uint)bVar10 * auVar45._28_4_ |
                                            (uint)!bVar10 * (int)pfVar30[7]);
                        pfVar30[8] = (float)((uint)(bVar19 & 1) * auVar45._32_4_ |
                                            (uint)!(bool)(bVar19 & 1) * (int)pfVar30[8]);
                        pfVar30[9] = (float)((uint)bVar11 * auVar45._36_4_ |
                                            (uint)!bVar11 * (int)pfVar30[9]);
                        pfVar30[10] = (float)((uint)bVar12 * auVar45._40_4_ |
                                             (uint)!bVar12 * (int)pfVar30[10]);
                        pfVar30[0xb] = (float)((uint)bVar13 * auVar45._44_4_ |
                                              (uint)!bVar13 * (int)pfVar30[0xb]);
                        pfVar30[0xc] = (float)((uint)bVar14 * auVar45._48_4_ |
                                              (uint)!bVar14 * (int)pfVar30[0xc]);
                        pfVar30[0xd] = (float)((uint)bVar15 * auVar45._52_4_ |
                                              (uint)!bVar15 * (int)pfVar30[0xd]);
                        pfVar30[0xe] = (float)((uint)bVar16 * auVar45._56_4_ |
                                              (uint)!bVar16 * (int)pfVar30[0xe]);
                        pfVar30[0xf] = (float)((uint)(bVar19 >> 7) * auVar45._60_4_ |
                                              (uint)!(bool)(bVar19 >> 7) * (int)pfVar30[0xf]);
                        uVar23 = uVar23 + 0x10;
                      } while ((iVar34 + 0xfU & 0xfffffff0) != uVar23);
                    }
                    lVar40 = lVar40 + 1;
                  } while (lVar40 != lVar37);
                }
              }
              auVar42 = ZEXT1664(auVar61);
              ppfVar26 = (float **)malloc((long)this->kMatrixCount << 3);
              auVar61 = auVar42._0_16_;
              this->gTransitionMatrices = ppfVar26;
              if (ppfVar26 != (float **)0x0) {
                if (0 < this->kMatrixCount) {
                  lVar36 = 0;
                  do {
                    local_88 = (float *)0x0;
                    posix_memalign(&local_88,0x20,
                                   (long)this->kCategoryCount * (long)this->kMatrixSize * 4);
                    auVar61 = auVar42._0_16_;
                    this->gTransitionMatrices[lVar36] = local_88;
                    if (this->gTransitionMatrices[lVar36] == (float *)0x0) goto LAB_00131081;
                    lVar36 = lVar36 + 1;
                  } while (lVar36 < this->kMatrixCount);
                }
                local_88 = (float *)0x0;
                posix_memalign(&local_88,0x20,
                               (long)this->kStateCount * (long)this->kPatternCount * 4);
                this->integrationTmp = local_88;
                sVar39 = (long)this->kStateCount * (long)this->kPatternCount * 4;
                pfVar28 = (float *)malloc(sVar39);
                this->firstDerivTmp = pfVar28;
                pfVar28 = (float *)malloc(sVar39);
                this->secondDerivTmp = pfVar28;
                local_88 = (float *)0x0;
                posix_memalign(&local_88,0x20,(long)this->kPaddedPatternCount << 2);
                this->grandDenominatorDerivTmp = local_88;
                local_88 = (float *)0x0;
                posix_memalign(&local_88,0x20,(long)this->kPaddedPatternCount << 2);
                this->grandNumeratorDerivTmp = local_88;
                this->crossProductNumeratorTmp = (float *)0x0;
                sVar39 = (long)this->kStateCount * (long)this->kPatternCount * 4;
                pfVar28 = (float *)malloc(sVar39);
                this->outLogLikelihoodsTmp = pfVar28;
                pfVar28 = (float *)malloc(sVar39);
                this->outFirstDerivativesTmp = pfVar28;
                pfVar28 = (float *)malloc(sVar39);
                this->outSecondDerivativesTmp = pfVar28;
                iVar2 = this->kPaddedPatternCount;
                sVar39 = (long)iVar2 * 4;
                pfVar28 = (float *)malloc(sVar39);
                this->zeros = pfVar28;
                pfVar30 = (float *)malloc(sVar39);
                this->ones = pfVar30;
                if (0 < (long)iVar2) {
                  uVar23 = 0;
                  memset(pfVar28,0,sVar39);
                  auVar42 = vpbroadcastq_avx512f();
                  auVar43 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                  auVar44 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                  auVar45 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                  do {
                    auVar46 = vpbroadcastq_avx512f();
                    auVar47 = vporq_avx512f(auVar46,auVar43);
                    auVar46 = vporq_avx512f(auVar46,auVar44);
                    uVar17 = vpcmpuq_avx512f(auVar46,auVar42,2);
                    uVar18 = vpcmpuq_avx512f(auVar47,auVar42,2);
                    bVar19 = (byte)uVar18;
                    uVar41 = CONCAT11(bVar19,(byte)uVar17);
                    pfVar28 = pfVar30 + uVar23;
                    bVar3 = (bool)((byte)uVar17 & 1);
                    bVar4 = (bool)((byte)(uVar41 >> 1) & 1);
                    bVar5 = (bool)((byte)(uVar41 >> 2) & 1);
                    bVar6 = (bool)((byte)(uVar41 >> 3) & 1);
                    bVar7 = (bool)((byte)(uVar41 >> 4) & 1);
                    bVar8 = (bool)((byte)(uVar41 >> 5) & 1);
                    bVar9 = (bool)((byte)(uVar41 >> 6) & 1);
                    bVar10 = (bool)((byte)(uVar41 >> 7) & 1);
                    bVar11 = (bool)(bVar19 >> 1 & 1);
                    bVar12 = (bool)(bVar19 >> 2 & 1);
                    bVar13 = (bool)(bVar19 >> 3 & 1);
                    bVar14 = (bool)(bVar19 >> 4 & 1);
                    bVar15 = (bool)(bVar19 >> 5 & 1);
                    bVar16 = (bool)(bVar19 >> 6 & 1);
                    *pfVar28 = (float)((uint)bVar3 * auVar45._0_4_ | (uint)!bVar3 * (int)*pfVar28);
                    pfVar28[1] = (float)((uint)bVar4 * auVar45._4_4_ |
                                        (uint)!bVar4 * (int)pfVar28[1]);
                    pfVar28[2] = (float)((uint)bVar5 * auVar45._8_4_ |
                                        (uint)!bVar5 * (int)pfVar28[2]);
                    pfVar28[3] = (float)((uint)bVar6 * auVar45._12_4_ |
                                        (uint)!bVar6 * (int)pfVar28[3]);
                    pfVar28[4] = (float)((uint)bVar7 * auVar45._16_4_ |
                                        (uint)!bVar7 * (int)pfVar28[4]);
                    pfVar28[5] = (float)((uint)bVar8 * auVar45._20_4_ |
                                        (uint)!bVar8 * (int)pfVar28[5]);
                    pfVar28[6] = (float)((uint)bVar9 * auVar45._24_4_ |
                                        (uint)!bVar9 * (int)pfVar28[6]);
                    pfVar28[7] = (float)((uint)bVar10 * auVar45._28_4_ |
                                        (uint)!bVar10 * (int)pfVar28[7]);
                    pfVar28[8] = (float)((uint)(bVar19 & 1) * auVar45._32_4_ |
                                        (uint)!(bool)(bVar19 & 1) * (int)pfVar28[8]);
                    pfVar28[9] = (float)((uint)bVar11 * auVar45._36_4_ |
                                        (uint)!bVar11 * (int)pfVar28[9]);
                    pfVar28[10] = (float)((uint)bVar12 * auVar45._40_4_ |
                                         (uint)!bVar12 * (int)pfVar28[10]);
                    pfVar28[0xb] = (float)((uint)bVar13 * auVar45._44_4_ |
                                          (uint)!bVar13 * (int)pfVar28[0xb]);
                    pfVar28[0xc] = (float)((uint)bVar14 * auVar45._48_4_ |
                                          (uint)!bVar14 * (int)pfVar28[0xc]);
                    pfVar28[0xd] = (float)((uint)bVar15 * auVar45._52_4_ |
                                          (uint)!bVar15 * (int)pfVar28[0xd]);
                    pfVar28[0xe] = (float)((uint)bVar16 * auVar45._56_4_ |
                                          (uint)!bVar16 * (int)pfVar28[0xe]);
                    pfVar28[0xf] = (float)((uint)(bVar19 >> 7) * auVar45._60_4_ |
                                          (uint)!(bool)(bVar19 >> 7) * (int)pfVar28[0xf]);
                    uVar23 = uVar23 + 0x10;
                  } while ((iVar2 + 0xfU & 0xfffffff0) != uVar23);
                }
                this->kThreadingEnabled = false;
                this->kAutoPartitioningEnabled = false;
                if ((this->kFlags & 0x40000000) != 0) {
                  auVar42 = ZEXT1664(auVar61);
                  uVar21 = std::thread::hardware_concurrency();
                  if (this->kStateCount < 5) {
                    this->kMinPatternCount = 0x100;
                    if ((int)uVar21 < 0x10) {
                      this->kMinPatternCount = 0x300;
                    }
                    else if (this->kPatternCount < 0x40000) {
                      uVar21 = 0x10;
                    }
                  }
                  else {
                    this->kMinPatternCount = 2;
                  }
                  iVar2 = this->kPatternCount;
                  if (2 < (int)uVar21 && this->kMinPatternCount <= iVar2) {
                    uVar22 = iVar2 / (this->kMinPatternCount / 2);
                    uVar38 = uVar21 >> 1;
                    if ((int)uVar22 < (int)(uVar21 >> 1)) {
                      uVar38 = uVar22;
                    }
                    pvVar31 = malloc((long)iVar2 * 4);
                    iVar20 = iVar2 / (int)uVar38;
                    if (0 < iVar2) {
                      auVar43 = vpbroadcastq_avx512f();
                      auVar44 = vpbroadcastd_avx512f();
                      auVar45 = vpbroadcastd_avx512f();
                      auVar46 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                      auVar47 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                      uVar23 = 0;
                      auVar48 = vpbroadcastq_avx512f(ZEXT816(0x10));
                      do {
                        uVar35 = vpcmpuq_avx512f(auVar47,auVar43,2);
                        iVar34 = (int)uVar23;
                        if ((uVar35 & 1) != 0) {
                          auVar42 = ZEXT464((uint)((long)((ulong)(uint)(iVar34 >> 0x1f) << 0x20 |
                                                         uVar23 & 0xffffffff) / (long)iVar20));
                        }
                        if ((uVar35 & 2) != 0) {
                          auVar61 = vpinsrd_avx(auVar42._0_16_,(iVar34 + 1) / iVar20,1);
                          auVar42 = vinserti32x4_avx512f(auVar42,auVar61,0);
                        }
                        if ((uVar35 & 4) != 0) {
                          auVar61 = vpinsrd_avx(auVar42._0_16_,(iVar34 + 2) / iVar20,2);
                          auVar42 = vinserti32x4_avx512f(auVar42,auVar61,0);
                        }
                        if ((uVar35 & 8) != 0) {
                          auVar61 = vpinsrd_avx(auVar42._0_16_,(iVar34 + 3) / iVar20,3);
                          auVar42 = vinserti32x4_avx512f(auVar42,auVar61,0);
                        }
                        auVar60 = auVar42;
                        if ((uVar35 & 0x10) != 0) {
                          auVar49 = vpbroadcastd_avx512f();
                          auVar60._0_16_ = auVar42._0_16_;
                          auVar60._16_4_ = auVar49._16_4_;
                          auVar60._20_4_ = auVar42._20_4_;
                          auVar60._24_4_ = auVar42._24_4_;
                          auVar60._28_4_ = auVar42._28_4_;
                          auVar60._32_4_ = auVar42._32_4_;
                          auVar60._36_4_ = auVar42._36_4_;
                          auVar60._40_4_ = auVar42._40_4_;
                          auVar60._44_4_ = auVar42._44_4_;
                          auVar60._48_4_ = auVar42._48_4_;
                          auVar60._52_4_ = auVar42._52_4_;
                          auVar60._56_4_ = auVar42._56_4_;
                          auVar60._60_4_ = auVar42._60_4_;
                        }
                        auVar49 = auVar60;
                        if ((uVar35 & 0x20) != 0) {
                          auVar42 = vpbroadcastd_avx512f();
                          auVar49._0_20_ = auVar60._0_20_;
                          auVar49._20_4_ = auVar42._20_4_;
                          auVar49._24_4_ = auVar60._24_4_;
                          auVar49._28_4_ = auVar60._28_4_;
                          auVar49._32_4_ = auVar60._32_4_;
                          auVar49._36_4_ = auVar60._36_4_;
                          auVar49._40_4_ = auVar60._40_4_;
                          auVar49._44_4_ = auVar60._44_4_;
                          auVar49._48_4_ = auVar60._48_4_;
                          auVar49._52_4_ = auVar60._52_4_;
                          auVar49._56_4_ = auVar60._56_4_;
                          auVar49._60_4_ = auVar60._60_4_;
                        }
                        auVar50 = auVar49;
                        if ((uVar35 & 0x40) != 0) {
                          auVar42 = vpbroadcastd_avx512f();
                          auVar50._0_24_ = auVar49._0_24_;
                          auVar50._24_4_ = auVar42._24_4_;
                          auVar50._28_4_ = auVar49._28_4_;
                          auVar50._32_4_ = auVar49._32_4_;
                          auVar50._36_4_ = auVar49._36_4_;
                          auVar50._40_4_ = auVar49._40_4_;
                          auVar50._44_4_ = auVar49._44_4_;
                          auVar50._48_4_ = auVar49._48_4_;
                          auVar50._52_4_ = auVar49._52_4_;
                          auVar50._56_4_ = auVar49._56_4_;
                          auVar50._60_4_ = auVar49._60_4_;
                        }
                        auVar51 = auVar50;
                        if ((uVar35 & 0x80) != 0) {
                          auVar42 = vpbroadcastd_avx512f();
                          auVar51._0_28_ = auVar50._0_28_;
                          auVar51._28_4_ = auVar42._28_4_;
                          auVar51._32_4_ = auVar50._32_4_;
                          auVar51._36_4_ = auVar50._36_4_;
                          auVar51._40_4_ = auVar50._40_4_;
                          auVar51._44_4_ = auVar50._44_4_;
                          auVar51._48_4_ = auVar50._48_4_;
                          auVar51._52_4_ = auVar50._52_4_;
                          auVar51._56_4_ = auVar50._56_4_;
                          auVar51._60_4_ = auVar50._60_4_;
                        }
                        uVar35 = vpcmpuq_avx512f(auVar46,auVar43,2);
                        auVar52 = auVar51;
                        if ((uVar35 & 1) != 0) {
                          auVar42 = vpbroadcastd_avx512f();
                          auVar52._0_32_ = auVar51._0_32_;
                          auVar52._32_4_ = auVar42._32_4_;
                          auVar52._36_4_ = auVar51._36_4_;
                          auVar52._40_4_ = auVar51._40_4_;
                          auVar52._44_4_ = auVar51._44_4_;
                          auVar52._48_4_ = auVar51._48_4_;
                          auVar52._52_4_ = auVar51._52_4_;
                          auVar52._56_4_ = auVar51._56_4_;
                          auVar52._60_4_ = auVar51._60_4_;
                        }
                        auVar53 = auVar52;
                        if ((uVar35 & 2) != 0) {
                          auVar42 = vpbroadcastd_avx512f();
                          auVar53._0_36_ = auVar52._0_36_;
                          auVar53._36_4_ = auVar42._36_4_;
                          auVar53._40_4_ = auVar52._40_4_;
                          auVar53._44_4_ = auVar52._44_4_;
                          auVar53._48_4_ = auVar52._48_4_;
                          auVar53._52_4_ = auVar52._52_4_;
                          auVar53._56_4_ = auVar52._56_4_;
                          auVar53._60_4_ = auVar52._60_4_;
                        }
                        auVar54 = auVar53;
                        if ((uVar35 & 4) != 0) {
                          auVar42 = vpbroadcastd_avx512f();
                          auVar54._0_40_ = auVar53._0_40_;
                          auVar54._40_4_ = auVar42._40_4_;
                          auVar54._44_4_ = auVar53._44_4_;
                          auVar54._48_4_ = auVar53._48_4_;
                          auVar54._52_4_ = auVar53._52_4_;
                          auVar54._56_4_ = auVar53._56_4_;
                          auVar54._60_4_ = auVar53._60_4_;
                        }
                        auVar55 = auVar54;
                        if ((uVar35 & 8) != 0) {
                          auVar42 = vpbroadcastd_avx512f();
                          auVar55._0_44_ = auVar54._0_44_;
                          auVar55._44_4_ = auVar42._44_4_;
                          auVar55._48_4_ = auVar54._48_4_;
                          auVar55._52_4_ = auVar54._52_4_;
                          auVar55._56_4_ = auVar54._56_4_;
                          auVar55._60_4_ = auVar54._60_4_;
                        }
                        auVar56 = auVar55;
                        if ((uVar35 & 0x10) != 0) {
                          auVar42 = vpbroadcastd_avx512f();
                          auVar56._0_48_ = auVar55._0_48_;
                          auVar56._48_4_ = auVar42._48_4_;
                          auVar56._52_4_ = auVar55._52_4_;
                          auVar56._56_4_ = auVar55._56_4_;
                          auVar56._60_4_ = auVar55._60_4_;
                        }
                        auVar57 = auVar56;
                        if ((uVar35 & 0x20) != 0) {
                          auVar42 = vpbroadcastd_avx512f();
                          auVar57._0_52_ = auVar56._0_52_;
                          auVar57._52_4_ = auVar42._52_4_;
                          auVar57._56_4_ = auVar56._56_4_;
                          auVar57._60_4_ = auVar56._60_4_;
                        }
                        auVar58 = auVar57;
                        if ((uVar35 & 0x40) != 0) {
                          auVar42 = vpbroadcastd_avx512f();
                          auVar58._0_56_ = auVar57._0_56_;
                          auVar58._56_4_ = auVar42._56_4_;
                          auVar58._60_4_ = auVar57._60_4_;
                        }
                        auVar59 = auVar58;
                        if ((uVar35 & 0x80) != 0) {
                          auVar42 = vpbroadcastd_avx512f();
                          auVar59._60_4_ = auVar42._60_4_;
                          auVar59._0_60_ = auVar58._0_60_;
                        }
                        uVar35 = vpcmpgtd_avx512f(auVar44,auVar59);
                        auVar60 = vpblendmd_avx512f(auVar45,auVar59);
                        bVar3 = (bool)((byte)uVar35 & 1);
                        auVar42._0_4_ = (uint)bVar3 * auVar60._0_4_ | (uint)!bVar3 * auVar59._0_4_;
                        bVar3 = (bool)((byte)(uVar35 >> 1) & 1);
                        auVar42._4_4_ = (uint)bVar3 * auVar60._4_4_ | (uint)!bVar3 * auVar59._4_4_;
                        bVar3 = (bool)((byte)(uVar35 >> 2) & 1);
                        auVar42._8_4_ = (uint)bVar3 * auVar60._8_4_ | (uint)!bVar3 * auVar59._8_4_;
                        bVar3 = (bool)((byte)(uVar35 >> 3) & 1);
                        auVar42._12_4_ =
                             (uint)bVar3 * auVar60._12_4_ | (uint)!bVar3 * auVar59._12_4_;
                        bVar3 = (bool)((byte)(uVar35 >> 4) & 1);
                        auVar42._16_4_ =
                             (uint)bVar3 * auVar60._16_4_ | (uint)!bVar3 * auVar59._16_4_;
                        bVar3 = (bool)((byte)(uVar35 >> 5) & 1);
                        auVar42._20_4_ =
                             (uint)bVar3 * auVar60._20_4_ | (uint)!bVar3 * auVar59._20_4_;
                        bVar3 = (bool)((byte)(uVar35 >> 6) & 1);
                        auVar42._24_4_ =
                             (uint)bVar3 * auVar60._24_4_ | (uint)!bVar3 * auVar59._24_4_;
                        bVar3 = (bool)((byte)(uVar35 >> 7) & 1);
                        auVar42._28_4_ =
                             (uint)bVar3 * auVar60._28_4_ | (uint)!bVar3 * auVar59._28_4_;
                        bVar3 = (bool)((byte)(uVar35 >> 8) & 1);
                        auVar42._32_4_ =
                             (uint)bVar3 * auVar60._32_4_ | (uint)!bVar3 * auVar59._32_4_;
                        bVar3 = (bool)((byte)(uVar35 >> 9) & 1);
                        auVar42._36_4_ =
                             (uint)bVar3 * auVar60._36_4_ | (uint)!bVar3 * auVar59._36_4_;
                        bVar3 = (bool)((byte)(uVar35 >> 10) & 1);
                        auVar42._40_4_ =
                             (uint)bVar3 * auVar60._40_4_ | (uint)!bVar3 * auVar59._40_4_;
                        bVar3 = (bool)((byte)(uVar35 >> 0xb) & 1);
                        auVar42._44_4_ =
                             (uint)bVar3 * auVar60._44_4_ | (uint)!bVar3 * auVar59._44_4_;
                        bVar3 = (bool)((byte)(uVar35 >> 0xc) & 1);
                        auVar42._48_4_ =
                             (uint)bVar3 * auVar60._48_4_ | (uint)!bVar3 * auVar59._48_4_;
                        bVar3 = (bool)((byte)(uVar35 >> 0xd) & 1);
                        auVar42._52_4_ =
                             (uint)bVar3 * auVar60._52_4_ | (uint)!bVar3 * auVar59._52_4_;
                        bVar3 = (bool)((byte)(uVar35 >> 0xe) & 1);
                        auVar42._56_4_ =
                             (uint)bVar3 * auVar60._56_4_ | (uint)!bVar3 * auVar59._56_4_;
                        bVar3 = SUB81(uVar35 >> 0xf,0);
                        auVar42._60_4_ =
                             (uint)bVar3 * auVar60._60_4_ | (uint)!bVar3 * auVar59._60_4_;
                        auVar60 = vmovdqu32_avx512f(auVar42);
                        *(undefined1 (*) [64])((long)pvVar31 + uVar23 * 4) = auVar60;
                        uVar23 = uVar23 + 0x10;
                        auVar47 = vpaddq_avx512f(auVar47,auVar48);
                        auVar46 = vpaddq_avx512f(auVar46,auVar48);
                      } while ((iVar2 + 0xfU & 0xfffffff0) != uVar23);
                    }
                    (*(this->super_BeagleImpl)._vptr_BeagleImpl[0xe])(this,(ulong)uVar38,pvVar31);
                    piVar32 = (int *)malloc((long)this->kPartitionCount *
                                            (long)*(int *)&(this->super_BeagleImpl).field_0xc * 0x24
                                           );
                    this->gAutoPartitionOperations = piVar32;
                    if (this->kMinPatternCount * 4 <= this->kPatternCount) {
                      piVar32 = (int *)malloc((long)(int)uVar38 * 4);
                      this->gAutoPartitionIndices = piVar32;
                      if (0 < (int)uVar38) {
                        auVar42 = vpbroadcastq_avx512f();
                        auVar43 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                        auVar44 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                        auVar45 = vpmovsxbd_avx512f(_DAT_00141b90);
                        lVar36 = 0;
                        auVar46 = vpbroadcastq_avx512f(ZEXT816(0x10));
                        auVar47 = vpbroadcastd_avx512f(ZEXT416(0x10));
                        do {
                          vpcmpuq_avx512f(auVar44,auVar42,2);
                          vpcmpuq_avx512f(auVar43,auVar42,2);
                          auVar48 = vmovdqu32_avx512f(auVar45);
                          *(undefined1 (*) [64])((long)piVar32 + lVar36) = auVar48;
                          auVar44 = vpaddq_avx512f(auVar44,auVar46);
                          auVar43 = vpaddq_avx512f(auVar43,auVar46);
                          auVar45 = vpaddd_avx512f(auVar45,auVar47);
                          lVar36 = lVar36 + 0x40;
                        } while ((ulong)(uVar38 + 0xf >> 4) << 6 != lVar36);
                      }
                      pdVar25 = (double *)malloc((long)(int)uVar38 << 3);
                      this->gAutoPartitionOutSumLogLikelihoods = pdVar25;
                      this->kAutoRootPartitioningEnabled = false;
                    }
                    this->kAutoPartitioningEnabled = false;
                  }
                }
                return 0;
              }
            }
          }
        }
      }
    }
  }
LAB_00131081:
  puVar33 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar33 = __cxa_init_primary_exception;
  __cxa_throw(puVar33,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::createInstance(int tipCount,
                                  int partialsBufferCount,
                                  int compactBufferCount,
                                  int stateCount,
                                  int patternCount,
                                  int eigenDecompositionCount,
                                  int matrixCount,
                                  int categoryCount,
                                  int scaleBufferCount,
                                  int resourceNumber,
                                  int pluginResourceNumber,
                                  long preferenceFlags,
                                  long requirementFlags) {
    if (DEBUGGING_OUTPUT)
        std::cerr << "in BeagleCPUImpl::initialize\n" ;

    if (DOUBLE_PRECISION) {
        realtypeMin = DBL_MIN;
        scalingExponentThreshold = 200;
    } else {
        realtypeMin = FLT_MIN;
        scalingExponentThreshold = 20;
    }

    kBufferCount = partialsBufferCount + compactBufferCount;
    kTipCount = tipCount;
    assert(kBufferCount > kTipCount);
    kStateCount = stateCount;
    kPatternCount = patternCount;

    kPartitionCount = 1;
    kMaxPartitionCount = kPartitionCount;
    kPartitionsInitialised = false;
    kPatternsReordered = false;

    kInternalPartialsBufferCount = kBufferCount - kTipCount;

    kTransPaddedStateCount = kStateCount + T_PAD;
    kPartialsPaddedStateCount = kStateCount + P_PAD;

    // Handle possible padding of pattern sites for vectorization
    int modulus = getPaddedPatternsModulus();
    kPaddedPatternCount = kPatternCount;
    int remainder = kPatternCount % modulus;
    if (remainder != 0) {
        kPaddedPatternCount += modulus - remainder;
    }
    kExtraPatterns = kPaddedPatternCount - kPatternCount;

    kMatrixCount = matrixCount;
    kEigenDecompCount = eigenDecompositionCount;
    kCategoryCount = categoryCount;
    kScaleBufferCount = scaleBufferCount;

    kMatrixSize = (T_PAD + kStateCount) * kStateCount;

    int scaleBufferSize = kPaddedPatternCount;

    kFlags = 0;

    if (preferenceFlags & BEAGLE_FLAG_SCALING_AUTO || requirementFlags & BEAGLE_FLAG_SCALING_AUTO) {
        kFlags |= BEAGLE_FLAG_SCALING_AUTO;
        kFlags |= BEAGLE_FLAG_SCALERS_LOG;
        kScaleBufferCount = kInternalPartialsBufferCount;
    } else if (preferenceFlags & BEAGLE_FLAG_SCALING_ALWAYS || requirementFlags & BEAGLE_FLAG_SCALING_ALWAYS) {
        kFlags |= BEAGLE_FLAG_SCALING_ALWAYS;
        kFlags |= BEAGLE_FLAG_SCALERS_LOG;
        kScaleBufferCount = kInternalPartialsBufferCount + 1; // +1 for temp buffer used by edgelikelihood
    } else if (preferenceFlags & BEAGLE_FLAG_SCALING_DYNAMIC || requirementFlags & BEAGLE_FLAG_SCALING_DYNAMIC) {
        kFlags |= BEAGLE_FLAG_SCALING_DYNAMIC;
        kFlags |= BEAGLE_FLAG_SCALERS_RAW;
    } else if (preferenceFlags & BEAGLE_FLAG_SCALERS_LOG || requirementFlags & BEAGLE_FLAG_SCALERS_LOG) {
        kFlags |= BEAGLE_FLAG_SCALING_MANUAL;
        kFlags |= BEAGLE_FLAG_SCALERS_LOG;
    } else {
        kFlags |= BEAGLE_FLAG_SCALING_MANUAL;
        kFlags |= BEAGLE_FLAG_SCALERS_RAW;
    }

    if (requirementFlags & BEAGLE_FLAG_EIGEN_COMPLEX || preferenceFlags & BEAGLE_FLAG_EIGEN_COMPLEX)
        kFlags |= BEAGLE_FLAG_EIGEN_COMPLEX;
    else
        kFlags |= BEAGLE_FLAG_EIGEN_REAL;

    if (requirementFlags & BEAGLE_FLAG_INVEVEC_TRANSPOSED || preferenceFlags & BEAGLE_FLAG_INVEVEC_TRANSPOSED)
        kFlags |= BEAGLE_FLAG_INVEVEC_TRANSPOSED;
    else
        kFlags |= BEAGLE_FLAG_INVEVEC_STANDARD;

    if (requirementFlags & BEAGLE_FLAG_THREADING_CPP || preferenceFlags & BEAGLE_FLAG_THREADING_CPP)
        kFlags |= BEAGLE_FLAG_THREADING_CPP;
    else
        kFlags |= BEAGLE_FLAG_THREADING_NONE;

    if (kFlags & BEAGLE_FLAG_EIGEN_COMPLEX)
        gEigenDecomposition = new EigenDecompositionSquare<BEAGLE_CPU_EIGEN_GENERIC>(kEigenDecompCount,
                kStateCount,kCategoryCount,kFlags);
    else
        gEigenDecomposition = new EigenDecompositionCube<BEAGLE_CPU_EIGEN_GENERIC>(kEigenDecompCount,
                kStateCount, kCategoryCount,kFlags);

    gCategoryRates = (double**) calloc(sizeof(double), kEigenDecompCount);
    if (gCategoryRates == NULL)
        throw std::bad_alloc();

    gPatternWeights = (double*) malloc(sizeof(double) * kPatternCount);
    if (gPatternWeights == NULL)
        throw std::bad_alloc();

    // TODO: if pattern padding is implemented this will create problems with setTipPartials
    kPartialsSize = kPaddedPatternCount * kPartialsPaddedStateCount * kCategoryCount;

    gPartials = (REALTYPE**) malloc(sizeof(REALTYPE*) * kBufferCount);
    if (gPartials == NULL)
     throw std::bad_alloc();

    gStateFrequencies = (REALTYPE**) calloc(sizeof(REALTYPE*), kEigenDecompCount);
    if (gStateFrequencies == NULL)
        throw std::bad_alloc();

    gCategoryWeights = (REALTYPE**) calloc(sizeof(REALTYPE*), kEigenDecompCount);
    if (gCategoryWeights == NULL)
        throw std::bad_alloc();

    // assigning kBufferCount to this array so that we can just check if a tipStateBuffer is
    // allocated
    gTipStates = (int**) malloc(sizeof(int*) * kBufferCount);
    if (gTipStates == NULL)
        throw std::bad_alloc();

    for (int i = 0; i < kBufferCount; i++) {
        gPartials[i] = NULL;
        gTipStates[i] = NULL;
    }

    for (int i = kTipCount; i < kBufferCount; i++) {
        gPartials[i] = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPartialsSize);
        if (gPartials[i] == NULL)
            throw std::bad_alloc();
    }

    gScaleBuffers = NULL;

    gAutoScaleBuffers = NULL;

    if (kFlags & BEAGLE_FLAG_SCALING_AUTO) {
        gAutoScaleBuffers = (signed short**) malloc(sizeof(signed short*) * kScaleBufferCount);
        if (gAutoScaleBuffers == NULL)
            throw std::bad_alloc();
        for (int i = 0; i < kScaleBufferCount; i++) {
            gAutoScaleBuffers[i] = (signed short*) malloc(sizeof(signed short) * scaleBufferSize);
            if (gAutoScaleBuffers[i] == 0L)
                throw std::bad_alloc();
        }
        gActiveScalingFactors = (int*) malloc(sizeof(int) * kInternalPartialsBufferCount);
        gScaleBuffers = (REALTYPE**) malloc(sizeof(REALTYPE*));
        gScaleBuffers[0] = (REALTYPE*) malloc(sizeof(REALTYPE) * scaleBufferSize);
    } else {
        gScaleBuffers = (REALTYPE**) malloc(sizeof(REALTYPE*) * kScaleBufferCount);
        if (gScaleBuffers == NULL)
            throw std::bad_alloc();

        for (int i = 0; i < kScaleBufferCount; i++) {
            gScaleBuffers[i] = (REALTYPE*) malloc(sizeof(REALTYPE) * scaleBufferSize);

            if (gScaleBuffers[i] == 0L)
                throw std::bad_alloc();


            if (kFlags & BEAGLE_FLAG_SCALING_DYNAMIC) {
                for (int j=0; j < scaleBufferSize; j++) {
                    gScaleBuffers[i][j] = 1.0;
                }
            }
        }
    }


    gTransitionMatrices = (REALTYPE**) malloc(sizeof(REALTYPE*) * kMatrixCount);
    if (gTransitionMatrices == NULL)
        throw std::bad_alloc();
    for (int i = 0; i < kMatrixCount; i++) {
        gTransitionMatrices[i] = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kMatrixSize * kCategoryCount);
        if (gTransitionMatrices[i] == 0L)
            throw std::bad_alloc();
    }

    integrationTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPatternCount * kStateCount);
    firstDerivTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount * kStateCount);
    secondDerivTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount * kStateCount);

//    cLikelihoodTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPatternCount * kCategoryCount);
    grandDenominatorDerivTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPaddedPatternCount); // TODO Deprecate in favor of integrationTmp
    grandNumeratorDerivTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPaddedPatternCount);
    crossProductNumeratorTmp = nullptr;
//    grandNumeratorLowerBoundDerivTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPatternCount);
//    grandNumeratorUpperBoundDerivTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPatternCount);

    outLogLikelihoodsTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount * kStateCount);
    outFirstDerivativesTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount * kStateCount);
    outSecondDerivativesTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount * kStateCount);

    zeros = (REALTYPE*) malloc(sizeof(REALTYPE) * kPaddedPatternCount);
    ones = (REALTYPE*) malloc(sizeof(REALTYPE) * kPaddedPatternCount);
    for(int i = 0; i < kPaddedPatternCount; i++) {
        zeros[i] = 0.0;
        ones[i] = 1.0;
    }

    kThreadingEnabled = false;
    kAutoPartitioningEnabled = false;
    if (kFlags & BEAGLE_FLAG_THREADING_CPP) {
        int hardwareThreads = std::thread::hardware_concurrency();
        if (kStateCount <= 4) {
            kMinPatternCount = BEAGLE_CPU_ASYNC_MIN_PATTERN_COUNT_LOW;
            if (hardwareThreads < BEAGLE_CPU_ASYNC_HW_THREAD_COUNT_THRESHOLD) {
                kMinPatternCount = BEAGLE_CPU_ASYNC_MIN_PATTERN_COUNT_HIGH;
            } else if (kPatternCount < BEAGLE_CPU_ASYNC_LIMIT_PATTERN_COUNT) {
                hardwareThreads = BEAGLE_CPU_ASYNC_HW_THREAD_COUNT_THRESHOLD;
            }
        } else {
            // todo: assess minimum pattern count for efficient auto-threading
            //       for higher state-count values
            kMinPatternCount = 2;
        }
        if (kPatternCount >= kMinPatternCount && hardwareThreads > 2) {
            int partitionCount = kPatternCount/(kMinPatternCount/2);
            if (partitionCount > hardwareThreads/2) {
                partitionCount = hardwareThreads/2;
            }
            int* patternPartitions = (int*) malloc(sizeof(int) * kPatternCount);
            int partitionSize = kPatternCount/partitionCount;
            for (int i=0; i<kPatternCount; i++) {
                int sitePartition = i/partitionSize;
                if (sitePartition > partitionCount - 1)
                    sitePartition = partitionCount - 1;
                patternPartitions[i] = sitePartition;
            }
            setPatternPartitions(partitionCount, patternPartitions);

            gAutoPartitionOperations = (int*) malloc(sizeof(int) * kBufferCount * kPartitionCount * BEAGLE_PARTITION_OP_COUNT);

            if (kPatternCount >= kMinPatternCount*4) {
                gAutoPartitionIndices = (int*) malloc(sizeof(int) * partitionCount);
                for (int i=0; i<partitionCount; i++) {
                    gAutoPartitionIndices[i] = i;
                }
                gAutoPartitionOutSumLogLikelihoods = (double*) malloc(sizeof(double) * partitionCount);
                kAutoRootPartitioningEnabled = false; //TODO: XJ: need to change this back to true
            }
            // TODO: XJ: need to change below back to true
            kAutoPartitioningEnabled = false;
        }
    }

    return BEAGLE_SUCCESS;
}